

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  ImVector<ImVec2> *path;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 *__src;
  ImVec2 IVar4;
  int iVar5;
  ImVec2 *__dest;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  float x1;
  float y1;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  path = &this->_Path;
  uVar10 = (ulong)(this->_Path).Size;
  IVar1 = (this->_Path).Data[uVar10 - 1];
  x1 = IVar1.x;
  y1 = IVar1.y;
  if (num_segments == 0) {
    PathBezierToCasteljau
              (path,x1,y1,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,this->_Data->CurveTessellationTol,0);
  }
  else if (0 < num_segments) {
    iVar6 = 1;
    do {
      fVar14 = (float)iVar6 * (1.0 / (float)num_segments);
      fVar12 = 1.0 - fVar14;
      IVar1 = *p2;
      IVar2 = *p3;
      IVar3 = *p4;
      iVar7 = (int)uVar10;
      if (iVar7 == (this->_Path).Capacity) {
        if (iVar7 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = ((int)(((uint)(uVar10 >> 0x1f) & 1) + iVar7) >> 1) + iVar7;
        }
        iVar8 = iVar7 + 1;
        if (iVar7 + 1 < iVar5) {
          iVar8 = iVar5;
        }
        __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
        __src = (this->_Path).Data;
        if (__src != (ImVec2 *)0x0) {
          memcpy(__dest,__src,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = __dest;
        (this->_Path).Capacity = iVar8;
        iVar7 = (this->_Path).Size;
      }
      else {
        __dest = (this->_Path).Data;
      }
      fVar11 = fVar12 * fVar12 * fVar12;
      fVar13 = fVar12 * fVar12 * 3.0 * fVar14;
      fVar12 = fVar12 * 3.0 * fVar14 * fVar14;
      fVar14 = fVar14 * fVar14 * fVar14;
      IVar4.y = fVar14 * IVar3.y + fVar12 * IVar2.y + fVar11 * y1 + fVar13 * IVar1.y;
      IVar4.x = fVar14 * IVar3.x + fVar12 * IVar2.x + fVar11 * x1 + fVar13 * IVar1.x;
      __dest[iVar7] = IVar4;
      uVar9 = path->Size + 1;
      uVar10 = (ulong)uVar9;
      path->Size = uVar9;
      iVar7 = (1 - num_segments) + iVar6;
      iVar6 = iVar6 + 1;
    } while (iVar7 != 1);
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        // Auto-tessellated
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0);
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
        {
            float t = t_step * i_step;
            float u = 1.0f - t;
            float w1 = u*u*u;
            float w2 = 3*u*u*t;
            float w3 = 3*u*t*t;
            float w4 = t*t*t;
            _Path.push_back(ImVec2(w1*p1.x + w2*p2.x + w3*p3.x + w4*p4.x, w1*p1.y + w2*p2.y + w3*p3.y + w4*p4.y));
        }
    }
}